

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O2

FormattedNumber __thiscall
icu_63::number::LocalizedNumberFormatter::formatDecimalQuantity
          (LocalizedNumberFormatter *this,DecimalQuantity *dq,UErrorCode *status)

{
  UFormattedNumberData *this_00;
  UErrorCode *in_RCX;
  UErrorCode *extraout_RDX;
  UErrorCode *extraout_RDX_00;
  UErrorCode *extraout_RDX_01;
  UErrorCode UVar1;
  UFormattedNumberData *p;
  FormattedNumber FVar2;
  
  if (*in_RCX < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = (UFormattedNumberData *)UMemory::operator_new((UMemory *)0x158,(size_t)dq);
    if (this_00 == (UFormattedNumberData *)0x0) {
      *in_RCX = U_MEMORY_ALLOCATION_ERROR;
      UVar1 = U_MEMORY_ALLOCATION_ERROR;
      status = extraout_RDX;
    }
    else {
      UVar1 = U_ZERO_ERROR;
      memset(this_00,0,0x158);
      impl::UFormattedNumberData::UFormattedNumberData(this_00);
      impl::DecimalQuantity::operator=(&this_00->quantity,(DecimalQuantity *)status);
      p = this_00;
      formatImpl((LocalizedNumberFormatter *)dq,this_00,in_RCX);
      status = extraout_RDX_00;
      if (*in_RCX < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00254cbd;
      impl::UFormattedNumberData::~UFormattedNumberData(this_00);
      UMemory::operator_delete((UMemory *)this_00,p);
      UVar1 = *in_RCX;
      status = extraout_RDX_01;
    }
  }
  else {
    UVar1 = U_ILLEGAL_ARGUMENT_ERROR;
  }
  this_00 = (UFormattedNumberData *)0x0;
LAB_00254cbd:
  *(UFormattedNumberData **)
   &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros =
       this_00;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.notation.
  fUnion.errorCode = UVar1;
  FVar2._8_8_ = status;
  FVar2.fResults = (UFormattedNumberData *)this;
  return FVar2;
}

Assistant:

FormattedNumber
LocalizedNumberFormatter::formatDecimalQuantity(const DecimalQuantity& dq, UErrorCode& status) const {
    if (U_FAILURE(status)) { return FormattedNumber(U_ILLEGAL_ARGUMENT_ERROR); }
    auto results = new UFormattedNumberData();
    if (results == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return FormattedNumber(status);
    }
    results->quantity = dq;
    formatImpl(results, status);

    // Do not save the results object if we encountered a failure.
    if (U_SUCCESS(status)) {
        return FormattedNumber(results);
    } else {
        delete results;
        return FormattedNumber(status);
    }
}